

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O2

void __thiscall Diligent::DataBlobAllocatorAdapter::Free(DataBlobAllocatorAdapter *this,void *Ptr)

{
  DataBlobImpl *pDVar1;
  string msg;
  
  pDVar1 = (this->m_pDataBlob).m_pObject;
  if (pDVar1 == (DataBlobImpl *)0x0) {
    FormatString<char[30]>(&msg,(char (*) [30])"Memory has not been allocated");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x79);
    std::__cxx11::string::~string((string *)&msg);
    pDVar1 = (this->m_pDataBlob).m_pObject;
  }
  if ((pDVar1->m_DataBuff).
      super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)Ptr) {
    FormatString<char[25]>(&msg,(char (*) [25])"Incorrect memory pointer");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x7a);
    std::__cxx11::string::~string((string *)&msg);
  }
  RefCntAutoPtr<Diligent::DataBlobImpl>::Release(&this->m_pDataBlob);
  return;
}

Assistant:

void DataBlobAllocatorAdapter::Free(void* Ptr)
{
    VERIFY(m_pDataBlob, "Memory has not been allocated");
    VERIFY(m_pDataBlob->GetDataPtr() == Ptr, "Incorrect memory pointer");
    m_pDataBlob.Release();
}